

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlPointCoordCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlPointCoordCaseInstance *this)

{
  TextureFormat TVar1;
  float fVar2;
  bool bVar3;
  deUint32 dVar4;
  float *__s;
  VkPhysicalDeviceProperties *pVVar5;
  float *pfVar6;
  TestError *this_00;
  ulong uVar7;
  int dy;
  int iVar8;
  int dx;
  int iVar9;
  int iVar10;
  int iVar11;
  iterator coord;
  uint uVar12;
  uint uVar13;
  float fVar14;
  Vec4 color;
  Surface refImage;
  Surface resImage;
  Random rnd;
  UVec2 viewportSize;
  PixelBufferAccess local_120;
  TestStatus *local_f8;
  Surface local_f0;
  float local_d8;
  float local_d4;
  int local_d0;
  float local_cc;
  int local_c8;
  int local_c4;
  float local_c0;
  RGBA local_bc;
  float *local_b8;
  float *local_b0;
  ulong local_a8;
  Surface local_a0;
  undefined1 local_88 [16];
  ConstPixelBufferAccess local_70;
  deRandom local_48;
  int local_38;
  int local_34;
  
  local_f8 = __return_storage_ptr__;
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  __s = (float *)operator_new(0xc0);
  memset(__s,0,0xc0);
  deRandom_init(&local_48,0x145fa);
  tcu::Surface::Surface(&local_a0,local_38,local_34);
  tcu::Surface::Surface(&local_f0,local_38,local_34);
  pVVar5 = Context::getDeviceProperties
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  fVar2 = (pVVar5->limits).pointSizeRange[0];
  fVar14 = (pVVar5->limits).pointSizeRange[1];
  local_88 = ZEXT416((uint)fVar14);
  if (fVar2 <= fVar14) {
    local_b8 = __s + 0x30;
    fVar14 = ceilf((fVar14 - fVar2) / (pVVar5->limits).pointSizeGranularity);
    iVar10 = 1;
    if (1 < (int)fVar14) {
      iVar10 = (int)fVar14;
    }
    pfVar6 = __s;
    do {
      fVar14 = deRandom_getFloat(&local_48);
      *pfVar6 = fVar14 * 1.8 + -0.9;
      fVar14 = deRandom_getFloat(&local_48);
      pfVar6[1] = fVar14 * 1.8 + -0.9;
      dVar4 = deRandom_getUint32(&local_48);
      fVar14 = (float)(int)(dVar4 % (iVar10 + 1U)) * (pVVar5->limits).pointSizeGranularity + fVar2;
      uVar12 = -(uint)((float)local_88._0_4_ <= fVar14);
      pfVar6[2] = (float)(uVar12 & local_88._0_4_ | ~uVar12 & (uint)fVar14);
      pfVar6 = pfVar6 + 3;
    } while (pfVar6 != local_b8);
    (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32_SFLOAT,0xc,0x10,__s);
    local_120.super_ConstPixelBufferAccess.m_format.order = 0x3e000000;
    local_120.super_ConstPixelBufferAccess.m_format.type = 0x3e800000;
    local_120.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
    local_120.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
    ShaderRenderCaseInstance::render
              (&this->super_ShaderRenderCaseInstance,0x10,0,(deUint16 *)0x0,
               VK_PRIMITIVE_TOPOLOGY_POINT_LIST,(Vec4 *)&local_120);
    local_70.m_format.order = RGBA;
    local_70.m_format.type = UNORM_INT8;
    if ((void *)local_a0.m_pixels.m_cap != (void *)0x0) {
      local_a0.m_pixels.m_cap = (size_t)local_a0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_120,&local_70.m_format,local_a0.m_width,local_a0.m_height,1,
               (void *)local_a0.m_pixels.m_cap);
    tcu::TextureLevel::getAccess(&local_70,&(this->super_ShaderRenderCaseInstance).m_resultImage);
    tcu::copy((EVP_PKEY_CTX *)&local_120,(EVP_PKEY_CTX *)&local_70);
    local_70.m_format.order = RGBA;
    local_70.m_format.type = UNORM_INT8;
    if ((void *)local_f0.m_pixels.m_cap != (void *)0x0) {
      local_f0.m_pixels.m_cap = (size_t)local_f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_120,&local_70.m_format,local_f0.m_width,local_f0.m_height,1,
               (void *)local_f0.m_pixels.m_cap);
    tcu::clear(&local_120,&(this->super_ShaderRenderCaseInstance).m_clearColor);
    local_d8 = (float)local_38;
    local_d4 = (float)local_34;
    pfVar6 = __s;
    do {
      local_cc = (pfVar6[1] * 0.5 + 0.5) * local_d4;
      fVar2 = pfVar6[2];
      fVar14 = fVar2 * -0.5 + local_cc;
      uVar12 = -(uint)(fVar14 < 0.0);
      uVar12 = (uint)((float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar14);
      uVar7 = (ulong)uVar12;
      fVar14 = fVar2 * 0.5 + local_cc;
      uVar13 = -(uint)(fVar14 < 0.0);
      local_c4 = (int)((float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000) + fVar14) - uVar12;
      local_b0 = pfVar6;
      local_a8 = uVar7;
      if (0 < local_c4) {
        local_c0 = (*pfVar6 * 0.5 + 0.5) * local_d8;
        fVar14 = fVar2 * -0.5 + local_c0;
        uVar12 = -(uint)(fVar14 < 0.0);
        local_d0 = (int)((float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar14);
        fVar14 = fVar2 * 0.5 + local_c0;
        uVar12 = -(uint)(fVar14 < 0.0);
        iVar11 = (int)((float)(~uVar12 & 0x3f000000 | uVar12 & 0xbf000000) + fVar14);
        local_c8 = iVar11 - local_d0;
        iVar10 = 0;
        do {
          if (0 < local_c8) {
            iVar8 = iVar10 + (int)local_a8;
            local_88._0_4_ = (((float)iVar8 + 0.5) - local_cc) / fVar2 + 0.5;
            iVar9 = local_d0;
            do {
              local_120.super_ConstPixelBufferAccess.m_format.type = local_88._0_4_;
              local_120.super_ConstPixelBufferAccess.m_format.order =
                   (ChannelOrder)((((float)iVar9 + 0.5) - local_c0) / fVar2 + 0.5);
              local_120.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
              local_120.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
              if ((((-1 < iVar9) && (iVar9 < local_f0.m_width)) && (-1 < iVar8)) &&
                 (iVar8 < local_f0.m_height)) {
                tcu::RGBA::RGBA(&local_bc,(Vec4 *)&local_120);
                *(deUint32 *)
                 ((long)local_f0.m_pixels.m_ptr + (long)(local_f0.m_width * (int)uVar7 + iVar9) * 4)
                     = local_bc.m_value;
              }
              iVar9 = iVar9 + 1;
            } while (iVar11 != iVar9);
          }
          iVar10 = iVar10 + 1;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (iVar10 != local_c4);
      }
      pfVar6 = local_b0 + 3;
    } while (pfVar6 != local_b8);
    bVar3 = tcu::fuzzyCompare(((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)
                              ->m_testCtx->m_log,"Result","Image comparison result",&local_f0,
                              &local_a0,0.02,COMPARE_LOG_RESULT);
    TVar1 = (TextureFormat)(local_120.super_ConstPixelBufferAccess.m_size.m_data + 2);
    local_120.super_ConstPixelBufferAccess.m_format = TVar1;
    if (bVar3) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Result image matches reference","");
      local_f8->m_code = QP_TEST_RESULT_PASS;
      (local_f8->m_description)._M_dataplus._M_p = (pointer)&(local_f8->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8->m_description,local_120.super_ConstPixelBufferAccess.m_format,
                 (undefined1 *)
                 (local_120.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
                 (long)local_120.super_ConstPixelBufferAccess.m_format));
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Image mismatch","");
      local_f8->m_code = QP_TEST_RESULT_FAIL;
      (local_f8->m_description)._M_dataplus._M_p = (pointer)&(local_f8->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8->m_description,local_120.super_ConstPixelBufferAccess.m_format,
                 (undefined1 *)
                 (local_120.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
                 (long)local_120.super_ConstPixelBufferAccess.m_format));
    }
    if (local_120.super_ConstPixelBufferAccess.m_format != TVar1) {
      operator_delete((void *)local_120.super_ConstPixelBufferAccess.m_format,
                      local_120.super_ConstPixelBufferAccess._16_8_ + 1);
    }
    tcu::Surface::~Surface(&local_f0);
    tcu::Surface::~Surface(&local_a0);
    operator_delete(__s,0xc0);
    return local_f8;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"minPointSize <= maxPointSize",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderBuiltinVarTests.cpp"
             ,0x212);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestStatus BuiltinGlPointCoordCaseInstance::iterate (void)
{
	const UVec2				viewportSize	= getViewportSize();
	const int				width			= viewportSize.x();
	const int				height			= viewportSize.y();
	const float				threshold		= 0.02f;
	const int				numPoints		= 16;
	vector<Vec3>			coords			(numPoints);
	de::Random				rnd				(0x145fa);
	Surface					resImage		(width, height);
	Surface					refImage		(width, height);
	bool					compareOk		= false;

	// Compute coordinates.
	{
		const VkPhysicalDeviceLimits&	limits					= m_context.getDeviceProperties().limits;
		const float						minPointSize			= limits.pointSizeRange[0];
		const float						maxPointSize			= limits.pointSizeRange[1];
		const int						pointSizeDeltaMultiples	= de::max(1, deCeilFloatToInt32((maxPointSize - minPointSize) / limits.pointSizeGranularity));

		TCU_CHECK(minPointSize <= maxPointSize);

		for (vector<Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
		{
			coord->x() = rnd.getFloat(-0.9f, 0.9f);
			coord->y() = rnd.getFloat(-0.9f, 0.9f);
			coord->z() = de::min(maxPointSize, minPointSize + float(rnd.getInt(0, pointSizeDeltaMultiples)) * limits.pointSizeGranularity);
		}
	}

	setup();
	addAttribute(0u, VK_FORMAT_R32G32B32_SFLOAT, deUint32(sizeof(Vec3)), numPoints, &coords[0]);
	render(numPoints, 0, DE_NULL, VK_PRIMITIVE_TOPOLOGY_POINT_LIST);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Draw reference
	clear(refImage.getAccess(), m_clearColor);

	for (vector<Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
	{
		const float	centerX	= float(width) *(pointIter->x()*0.5f + 0.5f);
		const float	centerY	= float(height)*(pointIter->y()*0.5f + 0.5f);
		const float	size	= pointIter->z();
		const int	x0		= deRoundFloatToInt32(centerX - size*0.5f);
		const int	y0		= deRoundFloatToInt32(centerY - size*0.5f);
		const int	x1		= deRoundFloatToInt32(centerX + size*0.5f);
		const int	y1		= deRoundFloatToInt32(centerY + size*0.5f);
		const int	w		= x1-x0;
		const int	h		= y1-y0;

		for (int yo = 0; yo < h; yo++)
		{
			for (int xo = 0; xo < w; xo++)
			{
				const int		dx		= x0+xo;
				const int		dy		= y0+yo;
				const float		fragX	= float(dx) + 0.5f;
				const float		fragY	= float(dy) + 0.5f;
				const float		s		= 0.5f + (fragX - centerX) / size;
				const float		t		= 0.5f + (fragY - centerY) / size;
				const Vec4		color	(s, t, 0.0f, 1.0f);

				if (de::inBounds(dx, 0, refImage.getWidth()) && de::inBounds(dy, 0, refImage.getHeight()))
					refImage.setPixel(dx, dy, RGBA(color));
			}
		}
	}

	compareOk = fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}